

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_embedded_C(Proc *proc,AstNode *node)

{
  Instruction *insn_00;
  Constant *constant;
  Pseudo *pseudo_00;
  Pseudo *pseudo;
  PtrListIterator symiter__;
  LuaSymbol *sym;
  Instruction *insn;
  AstNode *node_local;
  Proc *proc_local;
  
  if (((node->field_2).embedded_C_stmt.is_decl & 1U) == 0) {
    insn_00 = allocate_instruction(proc,op_C__unsafe,node->line_number);
    raviX_ptrlist_forward_iterator
              ((PtrListIterator *)&pseudo,(PtrList *)(node->field_2).local_stmt.var_list);
    symiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&pseudo);
    while (symiter__._16_8_ != 0) {
      if (*(int *)symiter__._16_8_ == 0) {
        add_instruction_operand(proc,insn_00,*(Pseudo **)(symiter__._16_8_ + 0x38));
      }
      else {
        handle_error(proc->linearizer->compiler_state,
                     "Variables referenced by embed C instruction must be locals");
      }
      symiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&pseudo);
    }
    constant = allocate_string_constant(proc,(node->field_2).goto_stmt.name);
    pseudo_00 = allocate_constant_pseudo(proc,constant);
    add_instruction_target(proc,insn_00,pseudo_00);
    add_instruction(proc,insn_00);
  }
  else {
    linearize_embedded_C_decl(proc,node);
  }
  return;
}

Assistant:

static void linearize_embedded_C(Proc *proc, AstNode *node)
{
	if (node->embedded_C_stmt.is_decl) {
		linearize_embedded_C_decl(proc, node);
		return;
	}

	Instruction *insn = allocate_instruction(proc, op_C__unsafe, node->line_number);
	LuaSymbol *sym;
	FOR_EACH_PTR(node->embedded_C_stmt.symbols, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			Pseudo *pseudo = sym->variable.pseudo;
			add_instruction_operand(proc, insn, pseudo);
		} else {
			handle_error(proc->linearizer->compiler_state,
				     "Variables referenced by embed C instruction must be locals");
		}
	}
	END_FOR_EACH_PTR(sym)
	add_instruction_target(proc, insn, allocate_constant_pseudo(proc, allocate_string_constant(proc, node->embedded_C_stmt.C_src_snippet)));
	add_instruction(proc, insn);
}